

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

void uv__print_handles(uv_loop_t *loop,int only_active)

{
  uint uVar1;
  char *pcVar2;
  void **ppvVar3;
  
  if (loop == (uv_loop_t *)0x0) {
    loop = uv_default_loop();
  }
  ppvVar3 = loop->handle_queue;
  while (ppvVar3 = (void **)*ppvVar3, ppvVar3 != loop->handle_queue) {
    if ((only_active == 0) || ((*(byte *)((long)ppvVar3 + 0x11) & 0x40) != 0)) {
      pcVar2 = "<unknown>";
      if (*(uint *)(ppvVar3 + -1) - 1 < 0x10) {
        pcVar2 = &DAT_00115650 + *(int *)(&DAT_00115650 + (ulong)(*(uint *)(ppvVar3 + -1) - 1) * 4);
      }
      uVar1 = *(uint *)(ppvVar3 + 2);
      fprintf(_stderr,"[%c%c%c] %-8s %p\n",(ulong)(uint)(int)"R-"[(uVar1 >> 0xd & 1) == 0],
              (ulong)(uint)(int)"A-"[(uVar1 >> 0xe & 1) == 0],
              (ulong)(uint)(int)"I-"[-1 < (short)uVar1],pcVar2,ppvVar3 + -4);
    }
  }
  return;
}

Assistant:

static void uv__print_handles(uv_loop_t* loop, int only_active) {
  const char* type;
  QUEUE* q;
  uv_handle_t* h;

  if (loop == NULL)
    loop = uv_default_loop();

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);

    if (only_active && !uv__is_active(h))
      continue;

    switch (h->type) {
#define X(uc, lc) case UV_##uc: type = #lc; break;
      UV_HANDLE_TYPE_MAP(X)
#undef X
      default: type = "<unknown>";
    }

    fprintf(stderr,
            "[%c%c%c] %-8s %p\n",
            "R-"[!(h->flags & UV__HANDLE_REF)],
            "A-"[!(h->flags & UV__HANDLE_ACTIVE)],
            "I-"[!(h->flags & UV__HANDLE_INTERNAL)],
            type,
            (void*)h);
  }
}